

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::student_t_dist<double>::cdf(student_t_dist<double> *this,result_type_conflict2 x)

{
  int iVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double q;
  double p;
  result_type_conflict2 t2;
  result_type_conflict2 t1;
  
  iVar1 = param_type::nu(in_RDI);
  dVar2 = sqrt(in_XMM0_Qa * in_XMM0_Qa + (double)iVar1);
  q = (in_XMM0_Qa + dVar2) / (dVar2 * 2.0);
  dVar2 = q;
  iVar1 = param_type::nu(in_RDI);
  p = (double)iVar1 / 2.0;
  param_type::nu(in_RDI);
  dVar2 = math::Beta_I(dVar2,p,q);
  return dVar2;
}

Assistant:

cdf(result_type x) const {
      const result_type t1{+math::sqrt(x * x + P.nu())};
      const result_type t2{(x + t1) / (2 * t1)};
      return math::Beta_I(t2, P.nu() / result_type(2), P.nu() / result_type(2));
    }